

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

void __thiscall docopt::BranchPattern::fix_repeating_arguments(BranchPattern *this)

{
  element_type *peVar1;
  Kind KVar2;
  size_type sVar3;
  LeafPattern *this_00;
  long lVar4;
  __node_base _Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer pvVar6;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  either;
  unordered_multiset<std::shared_ptr<docopt::Pattern>,_docopt::PatternHasher,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  group_set;
  undefined1 local_138 [8];
  undefined1 auStack_130 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  pointer local_a8;
  pointer local_a0;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  local_98;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_80;
  _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
  local_68;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(&local_80,&this->fChildren);
  transform(&local_98,&local_80);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(&local_80);
  local_a0 = local_98.
             super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar6 = local_98.
             super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                ((_Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                  *)&local_68,
                 (pvVar6->
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (pvVar6->
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,0,local_138,&local_108,&local_e8);
      for (_Var5._M_nxt = local_68._M_before_begin._M_nxt; _Var5._M_nxt != (_Hash_node_base *)0x0;
          _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
        sVar3 = std::
                _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                ::count(&local_68,(key_type *)(_Var5._M_nxt + 1));
        if (((sVar3 != 1) &&
            (peVar1 = (((key_type *)(_Var5._M_nxt + 1))->
                      super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
            peVar1 != (element_type *)0x0)) &&
           (this_00 = (LeafPattern *)
                      __dynamic_cast(peVar1,&Pattern::typeinfo,&LeafPattern::typeinfo),
           this_00 != (LeafPattern *)0x0)) {
          lVar4 = __dynamic_cast(this_00,&LeafPattern::typeinfo,&Command::typeinfo);
          if (lVar4 == 0) {
            lVar4 = __dynamic_cast(this_00,&LeafPattern::typeinfo,&Argument::typeinfo);
            if (lVar4 == 0) {
              if ((this_00->super_Pattern)._vptr_Pattern != (_func_int **)&PTR_flat_001b8308)
              goto LAB_0017ebb0;
              if (*(int *)((long)&this_00[1].fValue.variant + 0x10) == 0) goto LAB_0017e9d1;
            }
            local_108.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_108.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            KVar2 = (this_00->fValue).kind;
            if (KVar2 == String) {
              local_a8 = pvVar6;
              value::throwIfNotKind(&this_00->fValue,String);
              anon_unknown.dwarf_213df7::split(&local_e8,&(this_00->fValue).variant.strValue,0);
              auStack_130._8_8_ =
                   local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              auStack_130._0_8_ =
                   local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_138 = (undefined1  [8])
                          local_108.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_108.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_108.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_108.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_138);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_e8);
              KVar2 = (this_00->fValue).kind;
              pvVar6 = local_a8;
            }
            if (KVar2 != StringList) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_c8,&local_108);
              local_138._0_4_ = 4;
              auStack_130._0_8_ =
                   local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              auStack_130._8_8_ =
                   local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              auStack_130._16_8_ =
                   local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              LeafPattern::setValue(this_00,(value *)local_138);
              if (local_138._0_4_ == StringList) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_130);
              }
              else if ((local_138._0_4_ == String) &&
                      ((pointer)auStack_130._0_8_ != (pointer)(auStack_130 + 0x10))) {
                operator_delete((void *)auStack_130._0_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_c8);
            }
            this_01 = &local_108;
          }
          else {
LAB_0017e9d1:
            local_138._0_4_ = 2;
            auStack_130._0_8_ = (pointer)0x0;
            LeafPattern::setValue(this_00,(value *)local_138);
            if (local_138._0_4_ != StringList) {
              if ((local_138._0_4_ == String) &&
                 ((pointer)auStack_130._0_8_ != (pointer)(auStack_130 + 0x10))) {
                operator_delete((void *)auStack_130._0_8_);
              }
              goto LAB_0017ebb0;
            }
            this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_130;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_01);
        }
LAB_0017ebb0:
      }
      std::
      _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
      ::~_Hashtable(&local_68);
      pvVar6 = pvVar6 + 1;
    } while (pvVar6 != local_a0);
  }
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

Option Option::parse(std::string const& option_description)
{
	std::string shortOption, longOption;
	int argcount = 0;
	value val { false };
	
	auto double_space = option_description.find("  ");
	auto options_end = option_description.end();
	if (double_space != std::string::npos) {
		options_end = option_description.begin() + double_space;
	}
	
	static const std::regex pattern {"(--|-)?(.*?)([,= ]|$)"};
	for(std::sregex_iterator i {option_description.begin(), options_end, pattern, std::regex_constants::match_not_null},
	       e{};
	    i != e;
	    ++i)
	{
		std::smatch const& match = *i;
		if (match[1].matched) { // [1] is optional.
			if (match[1].length()==1) {
				shortOption = "-" + match[2].str();
			} else {
				longOption =  "--" + match[2].str();
			}
		} else if (match[2].length() > 0) { // [2] always matches.
			std::string m = match[2];
			argcount = 1;
		} else {
			// delimeter
		}

		if (match[3].length() == 0) { // [3] always matches.
			// Hit end of string. For some reason 'match_not_null' will let us match empty
			// at the end, and then we'll spin in an infinite loop. So, if we hit an empty
			// match, we know we must be at the end.
			break;
		}
	}

	if (argcount) {
		std::smatch match;
		if (std::regex_search(options_end, option_description.end(),
				      match,
				      std::regex{"\\[default: (.*)\\]", std::regex::icase}))
		{
			val = match[1].str();
		}
	}
	
	return {std::move(shortOption),
		std::move(longOption),
		argcount,
		std::move(val)};
}